

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::
     ParseUniformEnumProperty<tinyusdz::GeomMesh::SubdivisionScheme,tinyusdz::GeomMesh::SubdivisionScheme>
               (string *prop_name,bool strict_allowedToken_check,
               EnumHandlerFun<tinyusdz::GeomMesh::SubdivisionScheme> *enum_handler,Attribute *attr,
               TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *result,
               string *warn,string *err)

{
  bool bVar1;
  Variability VVar2;
  ostream *poVar3;
  PrimVar *pPVar4;
  value_type *pvVar5;
  string *psVar6;
  value_type *pvVar7;
  TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1730 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1710 [39];
  allocator local_16e9;
  string local_16e8 [32];
  fmt local_16c8 [32];
  ostringstream local_16a8 [8];
  ostringstream ss_e_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1530 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1510 [39];
  allocator local_14e9;
  string local_14e8 [32];
  fmt local_14c8 [32];
  ostringstream local_14a8 [8];
  ostringstream ss_e_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1310 [32];
  string local_12f0;
  allocator local_12c9;
  string local_12c8 [32];
  string local_12a8;
  ostringstream local_1288 [8];
  ostringstream ss_e_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0 [39];
  allocator local_10c9;
  string local_10c8 [32];
  string local_10a8;
  ostringstream local_1088 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0 [39];
  allocator local_ec9;
  string local_ec8 [32];
  string local_ea8;
  ostringstream local_e88 [8];
  ostringstream ss_e_5;
  undefined1 local_d10 [8];
  expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e_1;
  undefined1 local_cc0 [8];
  optional<tinyusdz::Token> tok_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78 [32];
  string local_c58;
  allocator local_c31;
  string local_c30 [32];
  string local_c10;
  ostringstream local_bf0 [8];
  ostringstream ss_e_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58 [39];
  allocator local_a31;
  string local_a30 [32];
  string local_a10;
  ostringstream local_9f0 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858 [39];
  allocator local_831;
  string local_830 [32];
  string local_810;
  ostringstream local_7f0 [8];
  ostringstream ss_e_3;
  undefined1 local_670 [8];
  expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e;
  undefined1 local_620 [8];
  optional<tinyusdz::Token> tok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8 [39];
  allocator local_5b1;
  string local_5b0 [32];
  fmt local_590 [32];
  ostringstream local_570 [8];
  ostringstream ss_e_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [32];
  fmt local_390 [32];
  ostringstream local_370 [8];
  ostringstream ss_e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  string *warn_local;
  TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *result_local;
  Attribute *attr_local;
  EnumHandlerFun<tinyusdz::GeomMesh::SubdivisionScheme> *enum_handler_local;
  bool strict_allowedToken_check_local;
  string *prop_name_local;
  
  if (result == (TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar3 = ::std::operator<<((ostream *)local_1b8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x644);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1b8,"[Internal error] `result` arg is nullptr.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::operator+(local_1d8,local_1f8);
      ::std::__cxx11::string::operator=((string *)err,(string *)local_1d8);
      ::std::__cxx11::string::~string((string *)local_1d8);
      ::std::__cxx11::string::~string((string *)local_1f8);
    }
    prop_name_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else {
    args_1 = result;
    bVar1 = Attribute::is_connection(attr);
    if (bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_370);
      poVar3 = ::std::operator<<((ostream *)local_370,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x648);
      ::std::operator<<(poVar3," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_3b0,
                 "Attribute connection is not supported in TinyUSDZ for built-in \'enum\' token attribute: {}"
                 ,&local_3b1);
      fmt::format<std::__cxx11::string>
                (local_390,(string *)local_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_name);
      poVar3 = ::std::operator<<((ostream *)local_370,(string *)local_390);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)local_390);
      ::std::__cxx11::string::~string(local_3b0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_3d8,local_3f8);
        ::std::__cxx11::string::operator=((string *)err,(string *)local_3d8);
        ::std::__cxx11::string::~string((string *)local_3d8);
        ::std::__cxx11::string::~string((string *)local_3f8);
      }
      prop_name_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_370);
    }
    else {
      VVar2 = Attribute::variability(attr);
      if (VVar2 == Uniform) {
        bVar1 = Attribute::is_blocked(attr);
        if (bVar1) {
          TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::set_blocked
                    (result,true);
          prop_name_local._7_1_ = true;
        }
        else {
          pPVar4 = Attribute::get_var(attr);
          bVar1 = primvar::PrimVar::is_timesamples(pPVar4);
          if (bVar1) {
            ::std::__cxx11::ostringstream::ostringstream(local_570);
            poVar3 = ::std::operator<<((ostream *)local_570,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x655);
            ::std::operator<<(poVar3," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_5b0,
                       "Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned."
                       ,&local_5b1);
            fmt::format<std::__cxx11::string>
                      (local_590,(string *)local_5b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       prop_name);
            poVar3 = ::std::operator<<((ostream *)local_570,(string *)local_590);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string((string *)local_590);
            ::std::__cxx11::string::~string(local_5b0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_5d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&tok.contained + 0x18));
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
              ::std::__cxx11::string::~string((string *)local_5d8);
              ::std::__cxx11::string::~string((string *)((long)&tok.contained + 0x18));
            }
            prop_name_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_570);
          }
          else {
            Attribute::get_value<tinyusdz::Token>
                      ((optional<tinyusdz::Token> *)
                       &e.contained.
                        super_storage_t_impl<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .m_has_value,attr);
            nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                      ((optional<tinyusdz::Token> *)local_620,
                       (optional<tinyusdz::Token> *)
                       &e.contained.
                        super_storage_t_impl<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .m_has_value);
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)
                       &e.contained.
                        super_storage_t_impl<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .m_has_value);
            bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_620);
            if (bVar1) {
              pvVar5 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                 ((optional<tinyusdz::Token> *)local_620);
              psVar6 = Token::str_abi_cxx11_(pvVar5);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()((expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_670,enum_handler,psVar6);
              bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_670);
              if (bVar1) {
                pvVar7 = nonstd::expected_lite::
                         expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::value((expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_670);
                TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::operator=
                          (result,pvVar7);
                prop_name_local._7_1_ = true;
              }
              else if (strict_allowedToken_check) {
                ::std::__cxx11::ostringstream::ostringstream(local_7f0);
                poVar3 = ::std::operator<<((ostream *)local_7f0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x65e);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_830,"Attribute `{}`: `{}` is not an allowed token.",&local_831);
                pvVar5 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                   ((optional<tinyusdz::Token> *)local_620);
                psVar6 = Token::str_abi_cxx11_(pvVar5);
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_810,(fmt *)local_830,prop_name,psVar6,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_1);
                poVar3 = ::std::operator<<((ostream *)local_7f0,(string *)&local_810);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)&local_810);
                ::std::__cxx11::string::~string(local_830);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_831);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::operator+(local_858,local_878);
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_858);
                  ::std::__cxx11::string::~string((string *)local_858);
                  ::std::__cxx11::string::~string((string *)local_878);
                }
                prop_name_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_7f0);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_9f0);
                poVar3 = ::std::operator<<((ostream *)local_9f0,"[warn]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x660);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_a30,"Attribute `{}`: `{}` is not an allowed token. Ignore it.",
                           &local_a31);
                pvVar5 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                   ((optional<tinyusdz::Token> *)local_620);
                psVar6 = Token::str_abi_cxx11_(pvVar5);
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_a10,(fmt *)local_a30,prop_name,psVar6,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_1);
                poVar3 = ::std::operator<<((ostream *)local_9f0,(string *)&local_a10);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)&local_a10);
                ::std::__cxx11::string::~string(local_a30);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_a31);
                if (warn != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::operator+(local_a58,local_a78);
                  ::std::__cxx11::string::operator=((string *)warn,(string *)local_a58);
                  ::std::__cxx11::string::~string((string *)local_a58);
                  ::std::__cxx11::string::~string((string *)local_a78);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_9f0);
                TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::set_value_empty
                          (result);
                prop_name_local._7_1_ = true;
              }
              nonstd::expected_lite::
              expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~expected((expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_670);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_bf0);
              poVar3 = ::std::operator<<((ostream *)local_bf0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x665);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_c30,
                         "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                         ,&local_c31);
              Attribute::type_name_abi_cxx11_(&local_c58,attr);
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        (&local_c10,(fmt *)local_c30,prop_name,&local_c58,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar3 = ::std::operator<<((ostream *)local_bf0,(string *)&local_c10);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)&local_c10);
              ::std::__cxx11::string::~string((string *)&local_c58);
              ::std::__cxx11::string::~string(local_c30);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_c31);
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_c78,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&tok_1.contained + 0x18));
                ::std::__cxx11::string::operator=((string *)err,(string *)local_c78);
                ::std::__cxx11::string::~string((string *)local_c78);
                ::std::__cxx11::string::~string((string *)((long)&tok_1.contained + 0x18));
              }
              prop_name_local._7_1_ = false;
              ::std::__cxx11::ostringstream::~ostringstream(local_bf0);
            }
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)local_620);
          }
        }
      }
      else {
        pPVar4 = Attribute::get_var(attr);
        bVar1 = primvar::PrimVar::is_scalar(pPVar4);
        if (bVar1) {
          bVar1 = Attribute::is_blocked(attr);
          if (bVar1) {
            TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::set_blocked
                      (result,true);
            prop_name_local._7_1_ = true;
          }
          else {
            Attribute::get_value<tinyusdz::Token>
                      ((optional<tinyusdz::Token> *)
                       &e_1.contained.
                        super_storage_t_impl<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .m_has_value,attr);
            nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                      ((optional<tinyusdz::Token> *)local_cc0,
                       (optional<tinyusdz::Token> *)
                       &e_1.contained.
                        super_storage_t_impl<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .m_has_value);
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)
                       &e_1.contained.
                        super_storage_t_impl<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .m_has_value);
            bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_cc0);
            if (bVar1) {
              pvVar5 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                 ((optional<tinyusdz::Token> *)local_cc0);
              psVar6 = Token::str_abi_cxx11_(pvVar5);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()((expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_d10,enum_handler,psVar6);
              bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_d10);
              if (bVar1) {
                pvVar7 = nonstd::expected_lite::
                         expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::value((expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_d10);
                TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::operator=
                          (result,pvVar7);
                prop_name_local._7_1_ = true;
              }
              else if (strict_allowedToken_check) {
                ::std::__cxx11::ostringstream::ostringstream(local_e88);
                poVar3 = ::std::operator<<((ostream *)local_e88,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x678);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_ec8,"Attribute `{}`: `{}` is not an allowed token.",&local_ec9);
                pvVar5 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                   ((optional<tinyusdz::Token> *)local_cc0);
                psVar6 = Token::str_abi_cxx11_(pvVar5);
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_ea8,(fmt *)local_ec8,prop_name,psVar6,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_1);
                poVar3 = ::std::operator<<((ostream *)local_e88,(string *)&local_ea8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)&local_ea8);
                ::std::__cxx11::string::~string(local_ec8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_ec9);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::operator+(local_ef0,local_f10);
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_ef0);
                  ::std::__cxx11::string::~string((string *)local_ef0);
                  ::std::__cxx11::string::~string((string *)local_f10);
                }
                prop_name_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_e88);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1088);
                poVar3 = ::std::operator<<((ostream *)local_1088,"[warn]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x67a);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_10c8,"Attribute `{}`: `{}` is not an allowed token. Ignore it.",
                           &local_10c9);
                pvVar5 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                   ((optional<tinyusdz::Token> *)local_cc0);
                psVar6 = Token::str_abi_cxx11_(pvVar5);
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_10a8,(fmt *)local_10c8,prop_name,psVar6,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_1);
                poVar3 = ::std::operator<<((ostream *)local_1088,(string *)&local_10a8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)&local_10a8);
                ::std::__cxx11::string::~string(local_10c8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
                if (warn != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::operator+(local_10f0,local_1110);
                  ::std::__cxx11::string::operator=((string *)warn,(string *)local_10f0);
                  ::std::__cxx11::string::~string((string *)local_10f0);
                  ::std::__cxx11::string::~string((string *)local_1110);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_1088);
                TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::set_value_empty
                          (result);
                prop_name_local._7_1_ = true;
              }
              nonstd::expected_lite::
              expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~expected((expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_d10);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_1288);
              poVar3 = ::std::operator<<((ostream *)local_1288,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x67f);
              ::std::operator<<(poVar3," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_12c8,
                         "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                         ,&local_12c9);
              Attribute::type_name_abi_cxx11_(&local_12f0,attr);
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        (&local_12a8,(fmt *)local_12c8,prop_name,&local_12f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar3 = ::std::operator<<((ostream *)local_1288,(string *)&local_12a8);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)&local_12a8);
              ::std::__cxx11::string::~string((string *)&local_12f0);
              ::std::__cxx11::string::~string(local_12c8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_12c9);
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1310,local_1330);
                ::std::__cxx11::string::operator=((string *)err,(string *)local_1310);
                ::std::__cxx11::string::~string((string *)local_1310);
                ::std::__cxx11::string::~string((string *)local_1330);
              }
              prop_name_local._7_1_ = false;
              ::std::__cxx11::ostringstream::~ostringstream(local_1288);
            }
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)local_cc0);
          }
        }
        else {
          pPVar4 = Attribute::get_var(attr);
          bVar1 = primvar::PrimVar::is_timesamples(pPVar4);
          if (bVar1) {
            ::std::__cxx11::ostringstream::ostringstream(local_14a8);
            poVar3 = ::std::operator<<((ostream *)local_14a8,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x683);
            ::std::operator<<(poVar3," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_14e8,
                       "Attribute `{}` is uniform variability, but TimeSampled value is authored.",
                       &local_14e9);
            fmt::format<std::__cxx11::string>
                      (local_14c8,(string *)local_14e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       prop_name);
            poVar3 = ::std::operator<<((ostream *)local_14a8,(string *)local_14c8);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string((string *)local_14c8);
            ::std::__cxx11::string::~string(local_14e8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_14e9);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_1510,local_1530);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_1510);
              ::std::__cxx11::string::~string((string *)local_1510);
              ::std::__cxx11::string::~string((string *)local_1530);
            }
            prop_name_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_14a8);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_16a8);
            poVar3 = ::std::operator<<((ostream *)local_16a8,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ParseUniformEnumProperty");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x686);
            ::std::operator<<(poVar3," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_16e8,"Internal error. Attribute `{}` is invalid",&local_16e9);
            fmt::format<std::__cxx11::string>
                      (local_16c8,(string *)local_16e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       prop_name);
            poVar3 = ::std::operator<<((ostream *)local_16a8,(string *)local_16c8);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string((string *)local_16c8);
            ::std::__cxx11::string::~string(local_16e8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_16e9);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_1710,local_1730);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_1710);
              ::std::__cxx11::string::~string((string *)local_1710);
              ::std::__cxx11::string::~string((string *)local_1730);
            }
            prop_name_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_16a8);
          }
        }
      }
    }
  }
  return prop_name_local._7_1_;
}

Assistant:

bool ParseUniformEnumProperty(
  const std::string &prop_name,
  bool strict_allowedToken_check,
  EnumHandlerFun<EnumTy> enum_handler,
  const Attribute &attr,
  TypedAttributeWithFallback<T> *result,
  std::string *warn = nullptr,
  std::string *err = nullptr)
{

  if (!result) {
    PUSH_ERROR_AND_RETURN("[Internal error] `result` arg is nullptr.");
  }

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN_F("Attribute connection is not supported in TinyUSDZ for built-in 'enum' token attribute: {}", prop_name);
  }


  if (attr.variability() == Variability::Uniform) {
    // scalar

    if (attr.is_blocked()) {
      result->set_blocked(true);
      return true;
    }

    if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.", prop_name);
    }

    if (auto tok = attr.get_value<value::token>()) {
      auto e = enum_handler(tok.value().str());
      if (e) {
        (*result) = e.value();
        return true;
      } else if (strict_allowedToken_check) {
        PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
      } else {
        PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
        result->set_value_empty();
        return true;
      }
    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
    }


  } else {
    // uniform or TimeSamples
    if (attr.get_var().is_scalar()) {

      if (attr.is_blocked()) {
        result->set_blocked(true);
        return true;
      }

      if (auto tok = attr.get_value<value::token>()) {
        auto e = enum_handler(tok.value().str());
        if (e) {
          (*result) = e.value();
          return true;
        } else if (strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
        } else {
          PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
          result->set_value_empty();
          return true;
        }
      } else {
        PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
      }
    } else if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is uniform variability, but TimeSampled value is authored.",
 prop_name);

    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Attribute `{}` is invalid", prop_name);
    }

  }

  return false;
}